

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O2

void * Omega_h::host_malloc(size_t size)

{
  void *pvVar1;
  allocator local_92;
  ScopedTimer omega_h_scoped_function_timer;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_malloc.cpp"
             ,&local_92);
  std::operator+(&local_70,&local_30,":");
  std::__cxx11::to_string(&local_90,0x23);
  std::operator+(&local_50,&local_70,&local_90);
  begin_code("host_malloc",local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  pvVar1 = malloc(size);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return pvVar1;
}

Assistant:

void* host_malloc(std::size_t size) {
  OMEGA_H_TIME_FUNCTION;
#ifdef OMEGA_H_USE_CUDA
  void* tmp_ptr;
  auto cuda_malloc_size = size;
  if (cuda_malloc_size < 1) cuda_malloc_size = 1;
  auto const err = cudaMallocHost(&tmp_ptr, cuda_malloc_size);
  if (err == cudaErrorMemoryAllocation) return nullptr;
  OMEGA_H_CHECK(err == cudaSuccess);
  return tmp_ptr;
#else
  return ::std::malloc(size);
#endif
}